

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O3

void __thiscall QPDF::writeHPageOffset(QPDF *this,BitWriter *w)

{
  vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> *vec;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *pvVar2;
  unsigned_long_long val;
  offset_in_HPageOffsetEntry_to_vector<int,_std::allocator<int>_> in_R9;
  int iVar3;
  ulong i;
  
  _Var1._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  BitWriter::writeBitsInt(w,((_Var1._M_head_impl)->page_offset_hints).min_nobjects,0x20);
  val = *(qpdf_offset_t *)((long)&(_Var1._M_head_impl)->page_offset_hints + 8);
  if ((long)val < 0) {
    QIntC::IntConverter<long_long,_unsigned_long_long,_true,_false>::error(val);
    val = *(qpdf_offset_t *)((long)&(_Var1._M_head_impl)->page_offset_hints + 8);
  }
  BitWriter::writeBits(w,val,0x20);
  BitWriter::writeBitsInt(w,*(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x10),0x10);
  BitWriter::writeBitsInt(w,*(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x14),0x20);
  BitWriter::writeBitsInt(w,*(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x18),0x10);
  iVar3 = *(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x1c);
  if (iVar3 < 0) {
    QIntC::IntConverter<int,_unsigned_long_long,_true,_false>::error(iVar3);
    iVar3 = *(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x1c);
  }
  BitWriter::writeBits(w,(long)iVar3,0x20);
  BitWriter::writeBitsInt(w,*(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x20),0x10);
  BitWriter::writeBitsInt(w,*(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x24),0x20);
  BitWriter::writeBitsInt(w,*(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x28),0x10);
  BitWriter::writeBitsInt(w,*(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x2c),0x10);
  BitWriter::writeBitsInt(w,*(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x30),0x10);
  BitWriter::writeBitsInt(w,*(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x34),0x10);
  BitWriter::writeBitsInt(w,*(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x38),0x10);
  pvVar2 = getAllPages(this);
  i = (long)(pvVar2->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(pvVar2->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
            _M_impl.super__Vector_impl_data._M_start >> 4;
  if ((i & 0xffffffff80000000) != 0) {
    QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(i);
  }
  vec = (vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> *)
        ((long)&(_Var1._M_head_impl)->page_offset_hints + 0x40);
  iVar3 = (int)i;
  write_vector_int<QPDF::HPageOffsetEntry,int>
            (w,iVar3,vec,*(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x10),0);
  write_vector_int<QPDF::HPageOffsetEntry,long_long>
            (w,iVar3,vec,*(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x18),8);
  write_vector_int<QPDF::HPageOffsetEntry,int>
            (w,iVar3,vec,*(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x2c),0x10);
  write_vector_vector<QPDF::HPageOffsetEntry>
            (w,iVar3,vec,
             (ulong)(uint)*(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x30),0x18,in_R9
            );
  write_vector_vector<QPDF::HPageOffsetEntry>
            (w,iVar3,vec,
             (ulong)(uint)*(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x34),0x30,in_R9
            );
  write_vector_int<QPDF::HPageOffsetEntry,long_long>
            (w,iVar3,vec,*(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x20),0x48);
  write_vector_int<QPDF::HPageOffsetEntry,long_long>
            (w,iVar3,vec,*(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x28),0x50);
  return;
}

Assistant:

void
QPDF::writeHPageOffset(BitWriter& w)
{
    HPageOffset& t = m->page_offset_hints;

    w.writeBitsInt(t.min_nobjects, 32);               // 1
    w.writeBits(toULL(t.first_page_offset), 32);      // 2
    w.writeBitsInt(t.nbits_delta_nobjects, 16);       // 3
    w.writeBitsInt(t.min_page_length, 32);            // 4
    w.writeBitsInt(t.nbits_delta_page_length, 16);    // 5
    w.writeBits(toULL(t.min_content_offset), 32);     // 6
    w.writeBitsInt(t.nbits_delta_content_offset, 16); // 7
    w.writeBitsInt(t.min_content_length, 32);         // 8
    w.writeBitsInt(t.nbits_delta_content_length, 16); // 9
    w.writeBitsInt(t.nbits_nshared_objects, 16);      // 10
    w.writeBitsInt(t.nbits_shared_identifier, 16);    // 11
    w.writeBitsInt(t.nbits_shared_numerator, 16);     // 12
    w.writeBitsInt(t.shared_denominator, 16);         // 13

    int nitems = toI(getAllPages().size());
    std::vector<HPageOffsetEntry>& entries = t.entries;

    write_vector_int(w, nitems, entries, t.nbits_delta_nobjects, &HPageOffsetEntry::delta_nobjects);
    write_vector_int(
        w, nitems, entries, t.nbits_delta_page_length, &HPageOffsetEntry::delta_page_length);
    write_vector_int(
        w, nitems, entries, t.nbits_nshared_objects, &HPageOffsetEntry::nshared_objects);
    write_vector_vector(
        w,
        nitems,
        entries,
        &HPageOffsetEntry::nshared_objects,
        t.nbits_shared_identifier,
        &HPageOffsetEntry::shared_identifiers);
    write_vector_vector(
        w,
        nitems,
        entries,
        &HPageOffsetEntry::nshared_objects,
        t.nbits_shared_numerator,
        &HPageOffsetEntry::shared_numerators);
    write_vector_int(
        w, nitems, entries, t.nbits_delta_content_offset, &HPageOffsetEntry::delta_content_offset);
    write_vector_int(
        w, nitems, entries, t.nbits_delta_content_length, &HPageOffsetEntry::delta_content_length);
}